

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QTzTimeZoneCacheEntry * __thiscall
QTzTimeZoneCache::fetchEntry(QTzTimeZoneCache *this,QByteArray *ianaId)

{
  long lVar1;
  QTzTimeZoneCacheEntry *pQVar2;
  qsizetype in_RSI;
  QTzTimeZoneCacheEntry *in_RDI;
  long in_FS_OFFSET;
  QTzTimeZoneCacheEntry *obj;
  QTzTimeZoneCacheEntry *ret;
  __single_object ptr;
  QMutexLocker<QMutex> locker;
  QByteArray *in_stack_00000100;
  QTzTimeZoneCacheEntry *in_stack_ffffffffffffff78;
  QTzTimeZoneCacheEntry *in_stack_ffffffffffffff80;
  QTzTimeZoneCacheEntry *in_stack_ffffffffffffff88;
  QTzTimeZoneCacheEntry *in_stack_ffffffffffffffa8;
  QByteArray *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,(QMutex *)in_stack_ffffffffffffff78);
  pQVar2 = QCache<QByteArray,_QTzTimeZoneCacheEntry>::object
                     ((QCache<QByteArray,_QTzTimeZoneCacheEntry> *)in_stack_ffffffffffffff80,
                      (QByteArray *)in_stack_ffffffffffffff78);
  if (pQVar2 == (QTzTimeZoneCacheEntry *)0x0) {
    QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
    *(undefined1 **)&in_RDI->m_preZoneRule = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_posixRule).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_posixRule).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_abbreviations).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_posixRule).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_abbreviations).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_abbreviations).d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranRules).d.ptr = (QTzTransitionRule *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranRules).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranTimes).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranRules).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranTimes).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m_tranTimes).d.ptr = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
    findEntry(in_stack_00000100);
    std::make_unique<QTzTimeZoneCacheEntry,QTzTimeZoneCacheEntry&>(in_stack_ffffffffffffff88);
    QMutexLocker<QMutex>::relock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
    std::unique_ptr<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>::release
              ((unique_ptr<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_> *)
               0x74c390);
    QCache<QByteArray,_QTzTimeZoneCacheEntry>::insert
              ((QCache<QByteArray,_QTzTimeZoneCacheEntry> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RSI);
    QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
    uVar3 = 0x1000000;
    std::unique_ptr<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_>::~unique_ptr
              ((unique_ptr<QTzTimeZoneCacheEntry,_std::default_delete<QTzTimeZoneCacheEntry>_> *)
               in_stack_ffffffffffffff80);
    if ((uVar3 & 0x1000000) == 0) {
      QTzTimeZoneCacheEntry::~QTzTimeZoneCacheEntry(in_stack_ffffffffffffff80);
    }
  }
  else {
    QTzTimeZoneCacheEntry::QTzTimeZoneCacheEntry
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::fetchEntry(const QByteArray &ianaId)
{
    QMutexLocker locker(&m_mutex);

    // search the cache...
    QTzTimeZoneCacheEntry *obj = m_cache.object(ianaId);
    if (obj)
        return *obj;

    // ... or build a new entry from scratch

    locker.unlock(); // don't parse files under mutex lock

    QTzTimeZoneCacheEntry ret = findEntry(ianaId);
    auto ptr = std::make_unique<QTzTimeZoneCacheEntry>(ret);

    locker.relock();
    m_cache.insert(ianaId, ptr.release()); // may overwrite if another thread was faster
    locker.unlock();

    return ret;
}